

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

CopyResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::CopySuffix(CordRepBtree *this,size_t offset)

{
  int *piVar1;
  RefcountAndFlags *pRVar2;
  CordRep **ppCVar3;
  byte bVar4;
  long lVar5;
  CordRepBtree *rep;
  size_t sVar6;
  bool bVar7;
  uint uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  CordRepBtree *rep_00;
  CordRepBtree *pCVar14;
  ulong uVar15;
  ulong uVar16;
  CordRepBtree *pCVar17;
  uint uVar18;
  CordRepBtree *pCVar19;
  size_t offset_00;
  size_t sVar20;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  CopyResult CVar24;
  
  uVar23 = (this->super_CordRep).length;
  uVar21 = uVar23 - offset;
  if (uVar23 < offset || uVar21 == 0) {
    __assert_fail("offset < this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,700,"CopyResult absl::cord_internal::CordRepBtree::CopySuffix(size_t)");
  }
  uVar18 = (uint)(this->super_CordRep).storage[0];
  pCVar19 = *(CordRepBtree **)
             ((this->super_CordRep).storage + (ulong)(this->super_CordRep).storage[2] * 8 + -5);
  uVar23 = (pCVar19->super_CordRep).length;
  if (uVar21 <= uVar23) {
    do {
      uVar16 = uVar23;
      rep_00 = pCVar19;
      if ((int)uVar18 < 1) {
        LOCK();
        pRVar2 = &(rep_00->super_CordRep).refcount;
        (pRVar2->count_).super___atomic_base<int>._M_i =
             (pRVar2->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
        uVar18 = 0xffffffff;
        sVar20 = uVar16 - uVar21;
        if (sVar20 != 0) {
          rep_00 = (CordRepBtree *)
                   anon_unknown_0::CreateSubstring(&rep_00->super_CordRep,sVar20,uVar21);
        }
        goto LAB_002c4604;
      }
      if ((rep_00->super_CordRep).tag != '\x03') goto LAB_002c4637;
      pCVar19 = *(CordRepBtree **)
                 ((rep_00->super_CordRep).storage +
                 (ulong)(rep_00->super_CordRep).storage[2] * 8 + -5);
      uVar23 = (pCVar19->super_CordRep).length;
      uVar18 = uVar18 - 1;
    } while (uVar21 <= uVar23);
    offset = uVar16 - uVar21;
    this = rep_00;
  }
  if (offset == 0) {
    LOCK();
    pRVar2 = &(this->super_CordRep).refcount;
    (pRVar2->count_).super___atomic_base<int>._M_i =
         (pRVar2->count_).super___atomic_base<int>._M_i + 2;
    UNLOCK();
    rep_00 = this;
  }
  else {
    uVar16 = (ulong)(this->super_CordRep).storage[1];
    uVar15 = 0;
    uVar23 = uVar16;
    do {
      ppCVar3 = this->edges_ + uVar23;
      uVar23 = uVar23 + 1;
      uVar15 = uVar15 + (*ppCVar3)->length;
      sVar20 = uVar15 - offset;
    } while (uVar15 < offset);
    if (uVar23 < uVar16) {
LAB_002c46b3:
      __assert_fail("begin >= this->begin()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x2c1,
                    "CordRepBtree *absl::cord_internal::CordRepBtree::CopyToEndFrom(size_t, size_t) const"
                   );
    }
    if ((this->super_CordRep).storage[2] < uVar23) {
LAB_002c46d2:
      __assert_fail("begin <= this->end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x2c2,
                    "CordRepBtree *absl::cord_internal::CordRepBtree::CopyToEndFrom(size_t, size_t) const"
                   );
    }
    rep_00 = (CordRepBtree *)operator_new(0x40);
    (rep_00->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
    (rep_00->super_CordRep).length = uVar21;
    uVar9 = *(undefined8 *)((long)this->edges_ + 4);
    uVar10 = *(undefined8 *)((long)this->edges_ + 0xc);
    uVar11 = *(undefined8 *)((long)this->edges_ + 0x14);
    uVar12 = *(undefined8 *)((long)this->edges_ + 0x1c);
    uVar13 = *(undefined8 *)((long)this->edges_ + 0x24);
    *(undefined8 *)&(rep_00->super_CordRep).tag = *(undefined8 *)&(this->super_CordRep).tag;
    *(undefined8 *)((long)rep_00->edges_ + 4) = uVar9;
    *(undefined8 *)((long)rep_00->edges_ + 0xc) = uVar10;
    *(undefined8 *)((long)rep_00->edges_ + 0x14) = uVar11;
    *(undefined8 *)((long)rep_00->edges_ + 0x1c) = uVar12;
    *(undefined8 *)((long)rep_00->edges_ + 0x24) = uVar13;
    *(undefined4 *)((long)rep_00->edges_ + 0x2c) = *(undefined4 *)((long)this->edges_ + 0x2c);
    (rep_00->super_CordRep).storage[1] = (uint8_t)uVar23;
    bVar4 = (rep_00->super_CordRep).storage[2];
    pCVar19 = rep_00;
    uVar8 = uVar18;
    if (((uint)uVar23 & 0xff) != (uint)bVar4) {
      uVar21 = (ulong)(((uint)uVar23 & 0xff) << 3);
      do {
        lVar5 = *(long *)((long)rep_00->edges_ + uVar21);
        if (lVar5 == 0) {
LAB_002c4618:
          __assert_fail("rep != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
        }
        LOCK();
        piVar1 = (int *)(lVar5 + 8);
        *piVar1 = *piVar1 + 2;
        UNLOCK();
        uVar21 = uVar21 + 8;
      } while ((ulong)bVar4 * 8 != uVar21);
    }
    do {
      if (sVar20 == 0) {
        (pCVar19->super_CordRep).storage[1] = (uint8_t)uVar23;
        break;
      }
      if (uVar23 == 0) {
        __assert_fail("pos.index >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                      ,0x2de,"CopyResult absl::cord_internal::CordRepBtree::CopySuffix(size_t)");
      }
      uVar21 = uVar23 - 1;
      (pCVar19->super_CordRep).storage[1] = (uint8_t)uVar21;
      if (uVar21 < (this->super_CordRep).storage[1]) {
        __assert_fail("index >= begin()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      if ((this->super_CordRep).storage[2] <= uVar21) {
        __assert_fail("index < end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      rep = *(CordRepBtree **)((this->super_CordRep).storage + uVar23 * 8 + -5);
      sVar6 = (rep->super_CordRep).length;
      offset_00 = sVar6 - sVar20;
      if ((int)uVar8 < 1) {
        LOCK();
        pRVar2 = &(rep->super_CordRep).refcount;
        (pRVar2->count_).super___atomic_base<int>._M_i =
             (pRVar2->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
        pCVar14 = rep;
        pCVar17 = pCVar19;
        uVar21 = uVar23;
        sVar22 = sVar20;
        if (sVar6 != sVar20) {
          pCVar14 = (CordRepBtree *)
                    anon_unknown_0::CreateSubstring(&rep->super_CordRep,offset_00,sVar20);
        }
      }
      else {
        if ((rep->super_CordRep).tag != '\x03') {
LAB_002c4637:
          __assert_fail("IsBtree()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                        ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
        }
        uVar16 = (ulong)(rep->super_CordRep).storage[1];
        uVar21 = uVar16;
        if (sVar6 == sVar20) {
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          do {
            ppCVar3 = rep->edges_ + uVar21;
            uVar21 = uVar21 + 1;
            uVar15 = uVar15 + (*ppCVar3)->length;
          } while (uVar15 < offset_00);
        }
        if (uVar21 < uVar16) goto LAB_002c46b3;
        if ((rep->super_CordRep).storage[2] < uVar21) goto LAB_002c46d2;
        sVar22 = uVar15 - offset_00;
        pCVar14 = (CordRepBtree *)operator_new(0x40);
        (pCVar14->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
        (pCVar14->super_CordRep).length = sVar20;
        uVar9 = *(undefined8 *)((long)rep->edges_ + 4);
        uVar10 = *(undefined8 *)((long)rep->edges_ + 0xc);
        uVar11 = *(undefined8 *)((long)rep->edges_ + 0x14);
        uVar12 = *(undefined8 *)((long)rep->edges_ + 0x1c);
        uVar13 = *(undefined8 *)((long)rep->edges_ + 0x24);
        *(undefined8 *)&(pCVar14->super_CordRep).tag = *(undefined8 *)&(rep->super_CordRep).tag;
        *(undefined8 *)((long)pCVar14->edges_ + 4) = uVar9;
        *(undefined8 *)((long)pCVar14->edges_ + 0xc) = uVar10;
        *(undefined8 *)((long)pCVar14->edges_ + 0x14) = uVar11;
        *(undefined8 *)((long)pCVar14->edges_ + 0x1c) = uVar12;
        *(undefined8 *)((long)pCVar14->edges_ + 0x24) = uVar13;
        *(undefined4 *)((long)pCVar14->edges_ + 0x2c) = *(undefined4 *)((long)rep->edges_ + 0x2c);
        (pCVar14->super_CordRep).storage[1] = (uint8_t)uVar21;
        bVar4 = (pCVar14->super_CordRep).storage[2];
        pCVar17 = pCVar14;
        this = rep;
        if ((uVar21 & 0xff) != (ulong)bVar4) {
          uVar16 = (ulong)(uint)((int)(uVar21 & 0xff) << 3);
          do {
            lVar5 = *(long *)((long)pCVar14->edges_ + uVar16);
            if (lVar5 == 0) goto LAB_002c4618;
            LOCK();
            piVar1 = (int *)(lVar5 + 8);
            *piVar1 = *piVar1 + 2;
            UNLOCK();
            uVar16 = uVar16 + 8;
          } while ((ulong)bVar4 * 8 != uVar16);
        }
      }
      *(CordRepBtree **)((pCVar19->super_CordRep).storage + uVar23 * 8 + -5) = pCVar14;
      bVar7 = 0 < (int)uVar8;
      pCVar19 = pCVar17;
      sVar20 = sVar22;
      uVar23 = uVar21;
      uVar8 = uVar8 - 1;
    } while (bVar7);
  }
LAB_002c4604:
  CVar24.height = uVar18;
  CVar24.edge = &rep_00->super_CordRep;
  CVar24._12_4_ = 0;
  return CVar24;
}

Assistant:

CopyResult CordRepBtree::CopySuffix(size_t offset) {
  assert(offset < this->length);

  // As long as `offset` starts inside the last edge, we can 'drop' the current
  // depth. For the most extreme example: if offset references the last data
  // edge in the tree, there is only a single edge / path from the top of the
  // tree to that last edge, so we can drop all the nodes except that edge.
  // The fast path check for this is `back->length >= length - offset`.
  int height = this->height();
  CordRepBtree* node = this;
  size_t len = node->length - offset;
  CordRep* back = node->Edge(kBack);
  while (back->length >= len) {
    offset = back->length - len;
    if (--height < 0) {
      return {MakeSubstring(CordRep::Ref(back), offset), height};
    }
    node = back->btree();
    back = node->Edge(kBack);
  }
  if (offset == 0) return {CordRep::Ref(node), height};

  // Offset does not point into the last edge, so we span at least two edges.
  // Find the index of offset with `IndexBeyond` which provides us the edge
  // 'beyond' the offset if offset is not a clean starting point of an edge.
  Position pos = node->IndexBeyond(offset);
  CordRepBtree* sub = node->CopyToEndFrom(pos.index, len);
  const CopyResult result = {sub, height};

  // `pos.n` contains a non zero value if the offset is not an exact starting
  // point of an edge. In this case, `pos.n` contains the 'trailing' amount of
  // bytes of the edge preceding that in `pos.index`. We need to iteratively
  // adjust the preceding edge with the 'broken' offset until we have a perfect
  // start of the edge.
  while (pos.n != 0) {
    assert(pos.index >= 1);
    const size_t begin = pos.index - 1;
    sub->set_begin(begin);
    CordRep* const edge = node->Edge(begin);

    len = pos.n;
    offset = edge->length - len;

    if (--height < 0) {
      sub->edges_[begin] = MakeSubstring(CordRep::Ref(edge), offset, len);
      return result;
    }

    node = edge->btree();
    pos = node->IndexBeyond(offset);

    CordRepBtree* nsub = node->CopyToEndFrom(pos.index, len);
    sub->edges_[begin] = nsub;
    sub = nsub;
  }
  sub->set_begin(pos.index);
  return result;
}